

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# canon_perftest.cc
# Opt level: O0

int main(void)

{
  int64_t iVar1;
  float *pfVar2;
  uint *puVar3;
  size_type sVar4;
  reference pvVar5;
  float local_164;
  ulong local_148;
  size_t i_1;
  uint local_138;
  float total;
  int max;
  int min;
  int delta;
  int i;
  uint64_t slash_bits;
  int64_t local_110;
  int64_t start;
  int kNumRepetitions;
  int j;
  size_t len;
  char buf [200];
  undefined1 local_28 [8];
  vector<int,_std::allocator<int>_> times;
  
  times.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_28);
  _kNumRepetitions = 0x4e;
  strcpy((char *)&len,
         "../../third_party/WebKit/Source/WebCore/platform/leveldb/LevelDBWriteBatch.cpp");
  for (start._4_4_ = 0; start._4_4_ < 5; start._4_4_ = start._4_4_ + 1) {
    start._0_4_ = 2000000;
    local_110 = GetTimeMillis();
    for (min = 0; min < 2000000; min = min + 1) {
      CanonicalizePath((char *)&len,(size_t *)&kNumRepetitions,(uint64_t *)&delta);
    }
    iVar1 = GetTimeMillis();
    max = (int)iVar1 - (int)local_110;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)local_28,&max);
  }
  pfVar2 = (float *)std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)local_28,0);
  total = *pfVar2;
  puVar3 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)local_28,0);
  local_138 = *puVar3;
  i_1._4_4_ = 0.0;
  for (local_148 = 0;
      sVar4 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)local_28), local_148 < sVar4;
      local_148 = local_148 + 1) {
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_28,local_148);
    i_1._4_4_ = (float)*pvVar5 + i_1._4_4_;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_28,local_148);
    if (*pvVar5 < (int)total) {
      pfVar2 = (float *)std::vector<int,_std::allocator<int>_>::operator[]
                                  ((vector<int,_std::allocator<int>_> *)local_28,local_148);
      total = *pfVar2;
    }
    else {
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_28,local_148);
      if ((int)local_138 < *pvVar5) {
        puVar3 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                   ((vector<int,_std::allocator<int>_> *)local_28,local_148);
        local_138 = *puVar3;
      }
    }
  }
  sVar4 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)local_28);
  local_164 = (float)sVar4;
  printf("min %dms  max %dms  avg %.1fms\n",(double)(i_1._4_4_ / local_164),(ulong)(uint)total,
         (ulong)local_138);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_28);
  return times.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage._4_4_;
}

Assistant:

int main() {
  vector<int> times;

  char buf[200];
  size_t len = strlen(kPath);
  strcpy(buf, kPath);

  for (int j = 0; j < 5; ++j) {
    const int kNumRepetitions = 2000000;
    int64_t start = GetTimeMillis();
    uint64_t slash_bits;
    for (int i = 0; i < kNumRepetitions; ++i) {
      CanonicalizePath(buf, &len, &slash_bits);
    }
    int delta = (int)(GetTimeMillis() - start);
    times.push_back(delta);
  }

  int min = times[0];
  int max = times[0];
  float total = 0;
  for (size_t i = 0; i < times.size(); ++i) {
    total += times[i];
    if (times[i] < min)
      min = times[i];
    else if (times[i] > max)
      max = times[i];
  }

  printf("min %dms  max %dms  avg %.1fms\n",
         min, max, total / times.size());
}